

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

Message * __thiscall testing::Message::operator<<(Message *this,ProbeStats *val)

{
  ostream *poVar1;
  pointer pdVar2;
  ostream *poVar3;
  double dVar4;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  poVar3 = (ostream *)
           ((this->ss_)._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x10);
  std::operator<<(poVar3,"{AvgRatio:");
  dVar4 = phmap::priv::anon_unknown_0::ProbeStats::AvgRatio(val);
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar1,", MaxRatio:");
  dVar4 = phmap::priv::anon_unknown_0::ProbeStats::MaxRatio(val);
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar1,", PercentileRatio:");
  dVar4 = phmap::priv::anon_unknown_0::ProbeStats::PercentileRatio(val,0.95);
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  poVar1 = std::operator<<(poVar1,", MaxProbe:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,", Probes=[");
  phmap::priv::anon_unknown_0::ProbeStats::ProbeNormalizedHistogram
            ((vector<double,_std::allocator<double>_> *)&local_40,val);
  for (pdVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
      pdVar2 != local_40._M_impl.super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>(*pdVar2);
    std::operator<<(poVar1,",");
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  std::operator<<(poVar3,"]}");
  return this;
}

Assistant:

inline Message& operator<<(const T& val) {
        // Some libraries overload << for STL containers.  These
    // overloads are defined in the global namespace instead of ::std.
    //
    // C++'s symbol lookup rule (i.e. Koenig lookup) says that these
    // overloads are visible in either the std namespace or the global
    // namespace, but not other namespaces, including the testing
    // namespace which Google Test's Message class is in.
    //
    // To allow STL containers (and other types that has a << operator
    // defined in the global namespace) to be used in Google Test
    // assertions, testing::Message must access the custom << operator
    // from the global namespace.  With this using declaration,
    // overloads of << defined in the global namespace and those
    // visible via Koenig lookup are both exposed in this function.
    using ::operator<<;
    *ss_ << val;
    return *this;
  }